

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_schema.c
# Opt level: O2

int tnt_schema_add_spaces(tnt_schema *schema_obj,tnt_reply *r)

{
  byte bVar1;
  int iVar2;
  tnt_schema_sval *val;
  uint64_t uVar3;
  char *__src;
  char *__dest;
  mh_assoc_t *pmVar4;
  assoc_val *ptr;
  int iVar5;
  uint32_t *arg;
  assoc_val ***ret;
  assoc_val ***ret_00;
  uint uVar6;
  byte *pbVar7;
  bool bVar8;
  assoc_val *local_58;
  assoc_val *local_50;
  mh_assoc_t *local_48;
  byte *local_40;
  byte *local_38;
  char *tuple;
  
  pmVar4 = schema_obj->space_hash;
  local_38 = (byte *)r->data;
  iVar2 = mp_check((char **)&local_38,r->data_end);
  iVar5 = -1;
  if (iVar2 == 0) {
    pbVar7 = (byte *)r->data;
    bVar1 = *pbVar7;
    if (mp_type_hint[bVar1] == MP_ARRAY) {
      local_38 = pbVar7 + 1;
      if ((bVar1 & 0x40) == 0) {
        uVar6 = bVar1 & 0xf;
      }
      else if ((bVar1 & 1) == 0) {
        local_38 = pbVar7 + 3;
        uVar6 = (uint)(ushort)(*(ushort *)(pbVar7 + 1) << 8 | *(ushort *)(pbVar7 + 1) >> 8);
      }
      else {
        uVar6 = *(uint *)(pbVar7 + 1);
        uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        local_38 = pbVar7 + 5;
      }
      local_48 = pmVar4;
      while (bVar8 = uVar6 != 0, uVar6 = uVar6 - 1, bVar8) {
        local_40 = local_38;
        bVar1 = *local_38;
        if (mp_type_hint[bVar1] != MP_ARRAY) {
LAB_00105b4d:
          ptr = (assoc_val *)0x0;
          val = (tnt_schema_sval *)0x0;
LAB_00105b53:
          mp_next((char **)&local_38);
          tnt_schema_sval_free(val);
          if (ptr != (assoc_val *)0x0) {
            tnt_mem_free(ptr);
          }
          return -1;
        }
        if ((bVar1 & 0x40) == 0) {
          pbVar7 = local_38 + 1;
        }
        else {
          pbVar7 = local_38 + (ulong)(bVar1 & 1) * 2 + 3;
        }
        local_40 = pbVar7;
        val = (tnt_schema_sval *)tnt_mem_alloc(0x18);
        if (val == (tnt_schema_sval *)0x0) goto LAB_00105b4d;
        val->index = (mh_assoc_t *)0x0;
        val->name = (char *)0x0;
        val->name_len = 0;
        val->number = 0;
        if (mp_type_hint[*pbVar7] != MP_UINT) {
LAB_00105b48:
          ptr = (assoc_val *)0x0;
          goto LAB_00105b53;
        }
        uVar3 = mp_decode_uint((char **)&local_40);
        val->number = (uint32_t)uVar3;
        mp_next((char **)&local_40);
        if (mp_type_hint[*local_40] != MP_STR) goto LAB_00105b48;
        __src = mp_decode_str((char **)&local_40,&val->name_len);
        __dest = (char *)tnt_mem_alloc((ulong)val->name_len);
        val->name = __dest;
        if (__dest == (char *)0x0) goto LAB_00105b48;
        memcpy(__dest,__src,(ulong)val->name_len);
        pmVar4 = mh_assoc_new();
        val->index = pmVar4;
        if ((pmVar4 == (mh_assoc_t *)0x0) ||
           (ptr = (assoc_val *)tnt_mem_alloc(0x18), local_58 = ptr, ptr == (assoc_val *)0x0))
        goto LAB_00105b48;
        (ptr->key).id = val->name;
        (ptr->key).id_len = val->name_len;
        ptr->data = val;
        local_50 = (assoc_val *)tnt_mem_alloc(0x18);
        pmVar4 = local_48;
        if (local_50 == (assoc_val *)0x0) goto LAB_00105b53;
        arg = &val->number;
        (local_50->key).id = (char *)arg;
        (local_50->key).id_len = 4;
        local_50->data = val;
        mh_assoc_put(local_48,&local_58,ret,arg);
        mh_assoc_put(pmVar4,&local_50,ret_00,arg);
        mp_next((char **)&local_38);
      }
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int tnt_schema_add_spaces(struct tnt_schema *schema_obj, struct tnt_reply *r) {
	struct mh_assoc_t *schema = schema_obj->space_hash;
	const char *tuple = r->data;
	if (mp_check(&tuple, tuple + (r->data_end - r->data)))
		return -1;
	tuple = r->data;
	if (mp_typeof(*tuple) != MP_ARRAY)
		return -1;
	uint32_t space_count = mp_decode_array(&tuple);
	while (space_count-- > 0) {
		if (tnt_schema_add_space(schema, &tuple))
			return -1;
	}
	return 0;
}